

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_device_descriptor_is_valid(ma_device_descriptor *pDeviceDescriptor)

{
  ma_device_descriptor *pDeviceDescriptor_local;
  
  if (pDeviceDescriptor == (ma_device_descriptor *)0x0) {
    pDeviceDescriptor_local._4_4_ = 0;
  }
  else if (pDeviceDescriptor->format == ma_format_unknown) {
    pDeviceDescriptor_local._4_4_ = 0;
  }
  else if ((pDeviceDescriptor->channels == 0) || (0x20 < pDeviceDescriptor->channels)) {
    pDeviceDescriptor_local._4_4_ = 0;
  }
  else if (pDeviceDescriptor->sampleRate == 0) {
    pDeviceDescriptor_local._4_4_ = 0;
  }
  else {
    pDeviceDescriptor_local._4_4_ = 1;
  }
  return pDeviceDescriptor_local._4_4_;
}

Assistant:

static ma_bool32 ma_device_descriptor_is_valid(const ma_device_descriptor* pDeviceDescriptor)
{
    if (pDeviceDescriptor == NULL) {
        return MA_FALSE;
    }

    if (pDeviceDescriptor->format == ma_format_unknown) {
        return MA_FALSE;
    }

    if (pDeviceDescriptor->channels < MA_MIN_CHANNELS || pDeviceDescriptor->channels > MA_MAX_CHANNELS) {
        return MA_FALSE;
    }

    if (pDeviceDescriptor->sampleRate == 0) {
        return MA_FALSE;
    }

    return MA_TRUE;
}